

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hr.cc
# Opt level: O1

size_t __thiscall OB::Hr::term_width(Hr *this,bool is_term)

{
  ulong local_18;
  winsize w;
  
  local_18 = this->width_;
  if (local_18 != 0) {
    return local_18;
  }
  if (is_term) {
    ioctl(1,0x5413,&local_18);
    return local_18 >> 0x10 & 0xffff;
  }
  return this->width_default_;
}

Assistant:

std::size_t Hr::term_width(bool const is_term) const
{
  if (width_ > 0)
  {
    return width_;
  }

  if (is_term)
  {
    std::size_t width {0};
    OB::Term::width(width);

    return width;
  }

  return width_default_;
}